

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_backend.cpp
# Opt level: O1

locale __thiscall
booster::locale::impl_posix::posix_localization_backend::install
          (posix_localization_backend *this,locale *base,locale_category_type category,
          character_facet_type type)

{
  char *pcVar1;
  message_format<wchar_t> *__f;
  message_format<char> *__f_00;
  undefined4 in_register_00000014;
  locale *in;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  character_facet_type in_R8D;
  messages_info minf;
  locale_data inf;
  shared_ptr<__locale_struct_*> local_1e0;
  shared_ptr<__locale_struct_*> local_1d0;
  shared_ptr<__locale_struct_*> local_1c0;
  shared_ptr<__locale_struct_*> local_1b0;
  undefined1 local_1a0 [32];
  string local_180;
  _Alloc_hider local_160;
  char local_150 [16];
  _Alloc_hider local_140;
  char local_130 [48];
  undefined1 local_100 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8 [2];
  locale_data local_b0;
  
  in = (locale *)CONCAT44(in_register_00000014,category);
  prepare_data((posix_localization_backend *)base);
  if ((int)type < 0x10) {
    switch(type) {
    case 1:
      local_1b0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)base[0x10]._M_impl;
      local_1b0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[0x11]._M_impl;
      if (local_1b0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1b0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1b0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1b0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1b0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      create_convert((impl_posix *)this,in,&local_1b0,in_R8D);
      this_00._M_pi =
           local_1b0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      break;
    case 2:
      local_1c0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)base[0x10]._M_impl;
      local_1c0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[0x11]._M_impl;
      if (local_1c0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1c0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1c0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1c0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1c0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      create_collate((impl_posix *)this,in,&local_1c0,in_R8D);
      this_00._M_pi =
           local_1c0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      break;
    default:
      goto switchD_001a21b9_caseD_3;
    case 4:
      local_1d0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)base[0x10]._M_impl;
      local_1d0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[0x11]._M_impl;
      if (local_1d0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1d0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1d0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1d0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1d0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      create_formatting((impl_posix *)this,in,&local_1d0,in_R8D);
      this_00._M_pi =
           local_1d0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      break;
    case 8:
      local_1e0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)base[0x10]._M_impl;
      local_1e0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[0x11]._M_impl;
      if (local_1e0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1e0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1e0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1e0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1e0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      create_parsing((impl_posix *)this,in,&local_1e0,in_R8D);
      this_00._M_pi =
           local_1e0.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  else {
    if ((int)type < 0x10000) {
      if (type == 0x10) {
        gnu_gettext::messages_info::messages_info((messages_info *)local_1a0);
        util::locale_data::locale_data(&local_b0);
        util::locale_data::parse(&local_b0,(string *)(base + 0xb));
        std::__cxx11::string::_M_assign((string *)local_1a0);
        std::__cxx11::string::_M_assign((string *)(local_1a0 + 0x20));
        std::__cxx11::string::_M_assign((string *)&local_160);
        std::__cxx11::string::_M_assign((string *)&local_140);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<booster::locale::gnu_gettext::messages_info::domain,std::allocator<booster::locale::gnu_gettext::messages_info::domain>>>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   base[4]._M_impl,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   base[5]._M_impl,
                   (vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
                    *)local_100);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(local_e8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(base + 1));
        if (in_R8D == 1) {
          __f_00 = gnu_gettext::create_messages_facet<char>((messages_info *)local_1a0);
          std::locale::locale<booster::locale::message_format<char>>((locale *)this,in,__f_00);
        }
        else if (in_R8D == 2) {
          __f = gnu_gettext::create_messages_facet<wchar_t>((messages_info *)local_1a0);
          std::locale::locale<booster::locale::message_format<wchar_t>>((locale *)this,in,__f);
        }
        else {
          std::locale::locale((locale *)this,in);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.encoding._M_dataplus._M_p != &local_b0.encoding.field_2) {
          operator_delete(local_b0.encoding._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.variant._M_dataplus._M_p != &local_b0.variant.field_2) {
          operator_delete(local_b0.variant._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.country._M_dataplus._M_p != &local_b0.country.field_2) {
          operator_delete(local_b0.country._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.language._M_dataplus._M_p != &local_b0.language.field_2) {
          operator_delete(local_b0.language._M_dataplus._M_p);
        }
        gnu_gettext::messages_info::~messages_info((messages_info *)local_1a0);
        return (locale)(_Impl *)this;
      }
      if (type == 0x20) {
        pcVar1 = nl_langinfo_l(0xe,*(__locale_t *)base[0x10]._M_impl);
        std::__cxx11::string::string((string *)local_1a0,pcVar1,(allocator *)&local_b0);
        create_codecvt((impl_posix *)this,in,(string *)local_1a0,in_R8D);
LAB_001a2466:
        if ((undefined1 *)local_1a0._0_8_ == local_1a0 + 0x10) {
          return (locale)(_Impl *)this;
        }
        operator_delete((void *)local_1a0._0_8_);
        return (locale)(_Impl *)this;
      }
    }
    else {
      if (type == 0x10000) {
        util::locale_data::locale_data((locale_data *)local_1a0);
        util::locale_data::parse((locale_data *)local_1a0,(string *)(base + 0xb));
        util::install_gregorian_calendar((util *)this,in,(string *)(local_1a0 + 0x20));
        if (local_140._M_p != local_130) {
          operator_delete(local_140._M_p);
        }
        if (local_160._M_p != local_150) {
          operator_delete(local_160._M_p);
        }
        if (local_180._M_dataplus._M_p != local_1a0 + 0x30) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        goto LAB_001a2466;
      }
      if (type == 0x20000) {
        util::create_info((util *)this,in,(string *)(base + 0xb));
        return (locale)(_Impl *)this;
      }
    }
switchD_001a21b9_caseD_3:
    std::locale::locale((locale *)this,in);
  }
  return (locale)(_Impl *)this;
}

Assistant:

virtual std::locale install(std::locale const &base,
                                    locale_category_type category,
                                    character_facet_type type = nochar_facet)
        {
            prepare_data();

            switch(category) {
            case convert_facet:
                return create_convert(base,lc_,type);
            case collation_facet:
                return create_collate(base,lc_,type);
            case formatting_facet:
                return create_formatting(base,lc_,type);
            case parsing_facet:
                return create_parsing(base,lc_,type);
            case codepage_facet:
                return create_codecvt(base,nl_langinfo_l(CODESET,*lc_),type);
            case calendar_facet:
                {
                    util::locale_data inf;
                    inf.parse(real_id_);
                    return util::install_gregorian_calendar(base,inf.country);
                }
            case message_facet:
                {
                    gnu_gettext::messages_info minf;
                    util::locale_data inf;
                    inf.parse(real_id_);
                    minf.language = inf.language;
                    minf.country = inf.country;
                    minf.variant = inf.variant;
                    minf.encoding = inf.encoding;
                    std::copy(domains_.begin(),domains_.end(),std::back_inserter<gnu_gettext::messages_info::domains_type>(minf.domains));
                    minf.paths = paths_;
                    switch(type) {
                    case char_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<char>(minf));
                    case wchar_t_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<wchar_t>(minf));
                    #ifdef BOOSTER_HAS_CHAR16_T
                    case char16_t_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<char16_t>(minf));
                    #endif
                    #ifdef BOOSTER_HAS_CHAR32_T
                    case char32_t_facet:
                        return std::locale(base,gnu_gettext::create_messages_facet<char32_t>(minf));
                    #endif
                    default:
                        return base;
                    }
                }
            case information_facet:
                return util::create_info(base,real_id_);
            default:
                return base;
            }
        }